

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall ExprTest_PLTerm_Test::TestBody(ExprTest_PLTerm_Test *this)

{
  ExprFactory *this_00;
  vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  *this_01;
  PLTermBuilder builder;
  PLTermBuilder builder_00;
  bool bVar1;
  char *pcVar2;
  Reference arg;
  AssertionResult gtest_ar_;
  PLTerm e;
  Reference var;
  AssertHelper local_98;
  AssertionResult local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  long local_70 [2];
  ExprBase local_60 [2];
  AssertHelper local_50;
  Reference local_48;
  PLTermBuilder local_40;
  
  local_60[0].impl_ = (Impl *)0x0;
  local_80.ptr_._0_1_ = (internal)0x1;
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  this_00 = &(this->super_ExprTest).factory_;
  this_01 = &(this->super_ExprTest).factory_.exprs_;
  local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_01,(Impl **)&local_80);
  local_40.impl_ = (Impl *)operator_new__(0x1c0);
  ((local_40.impl_)->super_Impl).kind_ = PLTERM;
  (this->super_ExprTest).factory_.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = (Impl *)local_40.impl_;
  (local_40.impl_)->num_breakpoints = 2;
  local_40.slope_index_ = 0;
  local_40.breakpoint_index_ = 0;
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_40,11.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint(&local_40,111.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_40,22.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint(&local_40,222.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_40,33.0);
  local_48 = mp::BasicExprFactory<std::allocator<char>_>::MakeReference
                       (this_00,FIRST_REFERENCE,0x2a);
  builder.slope_index_ = local_40.slope_index_;
  builder.breakpoint_index_ = local_40.breakpoint_index_;
  builder.impl_ = local_40.impl_;
  local_60[0].impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm(this_00,builder,local_48);
  local_90._0_4_ = 0x28;
  local_98.data_._0_4_ = (local_60[0].impl_)->kind_;
  testing::internal::CmpHelperEQ<mp::expr::Kind,mp::expr::Kind>
            ((internal *)&local_80,"expr::PLTERM","e.kind()",(Kind *)&local_90,(Kind *)&local_98);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf3,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((Impl *)local_90._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_90._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90._0_4_ = 2;
  local_98.data_._0_4_ = local_60[0].impl_[1].kind_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_80,"2","e.num_breakpoints()",(int *)&local_90,(int *)&local_98);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf4,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((Impl *)local_90._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_90._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90._0_4_ = 3;
  local_98.data_._0_4_ = local_60[0].impl_[1].kind_ + FIRST_EXPR;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_80,"3","e.num_slopes()",(int *)&local_90,(int *)&local_98);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf5,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((Impl *)local_90._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_90._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.data_._0_4_ = 0xb;
  local_90._0_8_ = mp::PLTerm::slope((PLTerm *)local_60,0);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_80,"11","e.slope(0)",(int *)&local_98,(double *)&local_90);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf6,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((Impl *)local_90._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_90._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.data_._0_4_ = 0x16;
  local_90._0_8_ = mp::PLTerm::slope((PLTerm *)local_60,1);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_80,"22","e.slope(1)",(int *)&local_98,(double *)&local_90);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf7,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((Impl *)local_90._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_90._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.data_._0_4_ = 0x21;
  local_90._0_8_ = mp::PLTerm::slope((PLTerm *)local_60,2);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_80,"33","e.slope(2)",(int *)&local_98,(double *)&local_90);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf8,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((Impl *)local_90._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_90._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_90.success_ == true) {
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"index out of bounds","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::PLTerm::slope((PLTerm *)local_60,-1);
    }
    testing::AssertionResult::operator<<
              (&local_90,
               (char (*) [97])
               "Expected: e.slope(-1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70) {
      operator_delete(local_80.ptr_,local_70[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_80);
  if (local_90.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_90.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xf9,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  if (local_80.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_80.ptr_ + 8))();
    }
    local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_90.success_ == true) {
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"index out of bounds","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::PLTerm::slope((PLTerm *)local_60,3);
    }
    testing::AssertionResult::operator<<
              (&local_90,
               (char (*) [96])
               "Expected: e.slope(3) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70) {
      operator_delete(local_80.ptr_,local_70[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_80);
  if (local_90.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_90.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xfa,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  if (local_80.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_80.ptr_ + 8))();
    }
    local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.data_._0_4_ = 0x6f;
  local_90._0_8_ = mp::PLTerm::breakpoint((PLTerm *)local_60,0);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_80,"111","e.breakpoint(0)",(int *)&local_98,(double *)&local_90);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xfb,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((Impl *)local_90._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_90._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.data_._0_4_ = 0xde;
  local_90._0_8_ = mp::PLTerm::breakpoint((PLTerm *)local_60,1);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_80,"222","e.breakpoint(1)",(int *)&local_98,(double *)&local_90);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xfc,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((Impl *)local_90._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_90._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_90.success_ == true) {
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"index out of bounds","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::PLTerm::breakpoint((PLTerm *)local_60,-1);
    }
    testing::AssertionResult::operator<<
              (&local_90,
               (char (*) [102])
               "Expected: e.breakpoint(-1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70) {
      operator_delete(local_80.ptr_,local_70[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_80);
  if (local_90.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_90.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xfd,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  if (local_80.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_80.ptr_ + 8))();
    }
    local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_90.success_ == true) {
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"index out of bounds","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::PLTerm::breakpoint((PLTerm *)local_60,2);
    }
    testing::AssertionResult::operator<<
              (&local_90,
               (char (*) [101])
               "Expected: e.breakpoint(2) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70) {
      operator_delete(local_80.ptr_,local_70[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_80);
  if (local_90.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_90.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xfe,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  if (local_80.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_80.ptr_ + 8))();
    }
    local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90._0_8_ = mp::internal::ExprBase::Create<mp::Reference>(*(Impl **)(local_60[0].impl_ + 2));
  testing::internal::CmpHelperEQ<mp::Reference,mp::Reference>
            ((internal *)&local_80,"var","e.arg()",&local_48,(Reference *)&local_90);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0xff,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((Impl *)local_90._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_90._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_90.success_ == true) {
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"invalid number of breakpoints","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm(this_00,0);
    }
    testing::AssertionResult::operator<<
              (&local_90,
               (char (*) [109])
               "Expected: factory_.BeginPLTerm(0) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70) {
      operator_delete(local_80.ptr_,local_70[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_80);
  if (local_90.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_90.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x100,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  if (local_80.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_80.ptr_ + 8))();
    }
    local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_01,(Impl **)&local_80);
  local_40.impl_ = (Impl *)operator_new__(0x140);
  ((local_40.impl_)->super_Impl).kind_ = PLTERM;
  (this->super_ExprTest).factory_.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = (Impl *)local_40.impl_;
  (local_40.impl_)->num_breakpoints = 1;
  local_40.slope_index_ = 0;
  local_40.breakpoint_index_ = 0;
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_40,0.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint(&local_40,0.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&local_40,1.0);
  local_90._0_8_ = mp::BasicExprFactory<std::allocator<char>_>::MakeReference(this_00,COMMON_EXPR,0)
  ;
  builder_00.slope_index_ = local_40.slope_index_;
  builder_00.breakpoint_index_ = local_40.breakpoint_index_;
  builder_00.impl_ = local_40.impl_;
  local_60[0].impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm
                         (this_00,builder_00,(Reference)local_90._0_8_);
  local_98.data_ =
       (AssertHelperData *)
       mp::internal::ExprBase::Create<mp::Reference>(*(Impl **)(local_60[0].impl_ + 2));
  testing::internal::CmpHelperEQ<mp::Reference,mp::Reference>
            ((internal *)&local_80,"arg","e.arg()",(Reference *)&local_90,(Reference *)&local_98);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x107
               ,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      local_98.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, PLTerm) {
  mp::PLTerm e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  ExprFactory::PLTermBuilder builder = factory_.BeginPLTerm(2);
  builder.AddSlope(11);
  builder.AddBreakpoint(111);
  builder.AddSlope(22);
  builder.AddBreakpoint(222);
  builder.AddSlope(33);
  auto var = factory_.MakeVariable(42);
  e = factory_.EndPLTerm(builder, var);
  EXPECT_EQ(expr::PLTERM, e.kind());
  EXPECT_EQ(2, e.num_breakpoints());
  EXPECT_EQ(3, e.num_slopes());
  EXPECT_EQ(11, e.slope(0));
  EXPECT_EQ(22, e.slope(1));
  EXPECT_EQ(33, e.slope(2));
  EXPECT_ASSERT(e.slope(-1), "index out of bounds");
  EXPECT_ASSERT(e.slope(3), "index out of bounds");
  EXPECT_EQ(111, e.breakpoint(0));
  EXPECT_EQ(222, e.breakpoint(1));
  EXPECT_ASSERT(e.breakpoint(-1), "index out of bounds");
  EXPECT_ASSERT(e.breakpoint(2), "index out of bounds");
  EXPECT_EQ(var, e.arg());
  EXPECT_ASSERT(factory_.BeginPLTerm(0), "invalid number of breakpoints");
  builder = factory_.BeginPLTerm(1);
  builder.AddSlope(0);
  builder.AddBreakpoint(0);
  builder.AddSlope(1);
  auto arg = factory_.MakeCommonExpr(0);
  e = factory_.EndPLTerm(builder, arg);
  EXPECT_EQ(arg, e.arg());
}